

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

void write_line(LineArray *line_array,char *line)

{
  uint uVar1;
  char **ppcVar2;
  uint32_t local_1c;
  char *line_local;
  LineArray *line_array_local;
  
  if (line_array->cap <= line_array->count) {
    if (line_array->cap < 8) {
      local_1c = 8;
    }
    else {
      local_1c = line_array->cap << 1;
    }
    line_array->cap = local_1c;
    ppcVar2 = (char **)reallocate(line_array->lines,(ulong)line_array->cap << 3);
    line_array->lines = ppcVar2;
  }
  uVar1 = line_array->count;
  line_array->count = uVar1 + 1;
  line_array->lines[uVar1] = line;
  return;
}

Assistant:

void write_line(LineArray *line_array, char *line) {
    if (line_array->count >= line_array->cap) {
        line_array->cap = GROW_CAP(line_array->cap);
        line_array->lines = GROW_ARR(line_array->lines, char *, line_array->cap);
    }

    line_array->lines[line_array->count++] = line;
}